

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_dec.c
# Opt level: O1

void ReconstructRow(VP8Decoder *dec,VP8ThreadContext *ctx)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  VP8MBData *pVVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  undefined8 uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  VP8DecIdct *pp_Var18;
  ulong uVar19;
  VP8TopSamples *pVVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  long lVar23;
  long lVar24;
  
  iVar13 = ctx->mb_y_;
  iVar3 = ctx->id_;
  puVar8 = dec->yuv_b_;
  lVar14 = 0;
  do {
    puVar8[lVar14 + 0x27] = 0x81;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x200);
  puVar2 = puVar8 + 600;
  lVar14 = 0;
  do {
    puVar8[lVar14 + 0x247] = 0x81;
    puVar8[lVar14 + 599] = 0x81;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0x100);
  if (iVar13 < 1) {
    builtin_memcpy(puVar8 + 7,
                   "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                   ,0x15);
    builtin_memcpy(puVar8 + 0x227,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",9);
    builtin_memcpy(puVar8 + 0x237,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",9);
  }
  else {
    puVar8[0x237] = 0x81;
    puVar8[0x227] = 0x81;
    puVar8[7] = 0x81;
  }
  if (0 < dec->mb_w_) {
    puVar1 = puVar8 + 0x28;
    uVar19 = (ulong)((uint)(iVar13 == 0) * 4);
    uVar15 = (ulong)(iVar13 == 0) + 5;
    lVar14 = 0x301;
    lVar24 = 0;
    do {
      pVVar9 = ctx->mb_data_;
      if (lVar24 != 0) {
        lVar16 = 0x14;
        do {
          *(undefined4 *)(puVar8 + lVar16 + -0x10) = *(undefined4 *)(puVar8 + lVar16);
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0x234);
        lVar16 = 0;
        do {
          *(undefined4 *)(puVar8 + lVar16 + 0x224) = *(undefined4 *)(puVar8 + lVar16 + 0x22c);
          *(undefined4 *)(puVar8 + lVar16 + 0x234) = *(undefined4 *)(puVar8 + lVar16 + 0x23c);
          lVar16 = lVar16 + 0x20;
        } while (lVar16 != 0x120);
      }
      pVVar20 = dec->yuv_t_ + lVar24;
      uVar4 = pVVar9[lVar24].non_zero_y_;
      if (0 < iVar13) {
        uVar12 = *(undefined8 *)(pVVar20->y + 8);
        *(undefined8 *)(puVar8 + 8) = *(undefined8 *)pVVar20->y;
        *(undefined8 *)(puVar8 + 0x10) = uVar12;
        *(undefined8 *)(puVar8 + 0x228) = *(undefined8 *)pVVar20->u;
        *(undefined8 *)(puVar8 + 0x238) = *(undefined8 *)pVVar20->v;
      }
      if (pVVar9[lVar24].is_i4x4_ != '\0') {
        if (0 < iVar13) {
          if (lVar24 < (long)dec->mb_w_ + -1) {
            iVar13 = *(int *)pVVar20[1].y;
          }
          else {
            iVar13 = (uint)pVVar20->y[0xf] * 0x1010101;
          }
          *(int *)(puVar8 + 0x18) = iVar13;
        }
        uVar5 = *(undefined4 *)(puVar8 + 0x18);
        *(undefined4 *)(puVar8 + 0x198) = uVar5;
        *(undefined4 *)(puVar8 + 0x118) = uVar5;
        *(undefined4 *)(puVar8 + 0x98) = uVar5;
        (*VP8PredLuma4[*(byte *)((long)pVVar9->coeffs_ + lVar14)])(puVar1);
        (*(code *)(&DAT_001b9d80 + *(int *)(&DAT_001b9d80 + (ulong)(uVar4 >> 0x1e) * 4)))();
        return;
      }
      uVar17 = uVar19;
      if (lVar24 == 0) {
        uVar17 = uVar15;
      }
      if (pVVar9[lVar24].imodes_[0] != 0) {
        uVar17 = (ulong)pVVar9[lVar24].imodes_[0];
      }
      (*VP8PredLuma16[uVar17])(puVar1);
      if (uVar4 != 0) {
        (*(code *)(&DAT_001b9d90 + *(int *)(&DAT_001b9d90 + (ulong)(uVar4 >> 0x1e) * 4)))();
        return;
      }
      uVar4 = pVVar9[lVar24].non_zero_uv_;
      uVar17 = uVar19;
      if (lVar24 == 0) {
        uVar17 = uVar15;
      }
      if (pVVar9[lVar24].uvmode_ != 0) {
        uVar17 = (ulong)pVVar9[lVar24].uvmode_;
      }
      (*VP8PredChroma8[uVar17])(puVar8 + 0x248);
      (*VP8PredChroma8[uVar17])(puVar2);
      if ((char)uVar4 != '\0') {
        pp_Var18 = &VP8TransformUV;
        if ((uVar4 & 0xaa) == 0) {
          pp_Var18 = &VP8TransformDCUV;
        }
        (**pp_Var18)(pVVar9[lVar24].coeffs_ + 0x100,puVar8 + 0x248);
      }
      if ((uVar4 & 0xff00) != 0) {
        pp_Var18 = &VP8TransformUV;
        if ((uVar4 & 0xaa00) == 0) {
          pp_Var18 = &VP8TransformDCUV;
        }
        (**pp_Var18)(pVVar9[lVar24].coeffs_ + 0x140,puVar2);
      }
      if (iVar13 < dec->mb_h_ + -1) {
        uVar12 = *(undefined8 *)(puVar8 + 0x210);
        *(undefined8 *)pVVar20->y = *(undefined8 *)(puVar8 + 0x208);
        *(undefined8 *)(pVVar20->y + 8) = uVar12;
        *(undefined8 *)pVVar20->u = *(undefined8 *)(puVar8 + 0x328);
        *(undefined8 *)pVVar20->v = *(undefined8 *)(puVar8 + 0x338);
      }
      iVar6 = dec->cache_y_stride_;
      puVar21 = dec->cache_y_;
      lVar16 = (long)dec->cache_uv_stride_ * (long)iVar3 * 8;
      puVar10 = dec->cache_u_;
      puVar11 = dec->cache_v_;
      lVar23 = 0;
      puVar22 = puVar1;
      do {
        iVar7 = dec->cache_y_stride_;
        uVar12 = *(undefined8 *)(puVar22 + 8);
        *(undefined8 *)
         (puVar21 +
         (long)(int)lVar23 * (long)iVar7 + (long)iVar6 * (long)iVar3 * 0x10 + lVar24 * 0x10) =
             *(undefined8 *)puVar22;
        *(undefined8 *)
         (puVar21 + (long)(int)lVar23 * (long)iVar7 +
                    (long)iVar6 * (long)iVar3 * 0x10 + lVar24 * 0x10 + 8) = uVar12;
        lVar23 = lVar23 + 1;
        puVar22 = puVar22 + 0x20;
      } while (lVar23 != 0x10);
      lVar23 = 0;
      puVar21 = puVar2;
      do {
        *(undefined8 *)
         (puVar10 + (long)dec->cache_uv_stride_ * (long)(int)lVar23 + lVar16 + lVar24 * 8) =
             *(undefined8 *)(puVar21 + -0x10);
        *(undefined8 *)
         (puVar11 + (long)dec->cache_uv_stride_ * (long)(int)lVar23 + lVar16 + lVar24 * 8) =
             *(undefined8 *)puVar21;
        lVar23 = lVar23 + 1;
        puVar21 = puVar21 + 0x20;
      } while (lVar23 != 8);
      lVar24 = lVar24 + 1;
      lVar14 = lVar14 + 800;
    } while (lVar24 < dec->mb_w_);
  }
  return;
}

Assistant:

static void ReconstructRow(const VP8Decoder* const dec,
                           const VP8ThreadContext* ctx) {
  int j;
  int mb_x;
  const int mb_y = ctx->mb_y_;
  const int cache_id = ctx->id_;
  uint8_t* const y_dst = dec->yuv_b_ + Y_OFF;
  uint8_t* const u_dst = dec->yuv_b_ + U_OFF;
  uint8_t* const v_dst = dec->yuv_b_ + V_OFF;

  // Initialize left-most block.
  for (j = 0; j < 16; ++j) {
    y_dst[j * BPS - 1] = 129;
  }
  for (j = 0; j < 8; ++j) {
    u_dst[j * BPS - 1] = 129;
    v_dst[j * BPS - 1] = 129;
  }

  // Init top-left sample on left column too.
  if (mb_y > 0) {
    y_dst[-1 - BPS] = u_dst[-1 - BPS] = v_dst[-1 - BPS] = 129;
  } else {
    // we only need to do this init once at block (0,0).
    // Afterward, it remains valid for the whole topmost row.
    memset(y_dst - BPS - 1, 127, 16 + 4 + 1);
    memset(u_dst - BPS - 1, 127, 8 + 1);
    memset(v_dst - BPS - 1, 127, 8 + 1);
  }

  // Reconstruct one row.
  for (mb_x = 0; mb_x < dec->mb_w_; ++mb_x) {
    const VP8MBData* const block = ctx->mb_data_ + mb_x;

    // Rotate in the left samples from previously decoded block. We move four
    // pixels at a time for alignment reason, and because of in-loop filter.
    if (mb_x > 0) {
      for (j = -1; j < 16; ++j) {
        Copy32b(&y_dst[j * BPS - 4], &y_dst[j * BPS + 12]);
      }
      for (j = -1; j < 8; ++j) {
        Copy32b(&u_dst[j * BPS - 4], &u_dst[j * BPS + 4]);
        Copy32b(&v_dst[j * BPS - 4], &v_dst[j * BPS + 4]);
      }
    }
    {
      // bring top samples into the cache
      VP8TopSamples* const top_yuv = dec->yuv_t_ + mb_x;
      const int16_t* const coeffs = block->coeffs_;
      uint32_t bits = block->non_zero_y_;
      int n;

      if (mb_y > 0) {
        memcpy(y_dst - BPS, top_yuv[0].y, 16);
        memcpy(u_dst - BPS, top_yuv[0].u, 8);
        memcpy(v_dst - BPS, top_yuv[0].v, 8);
      }

      // predict and add residuals
      if (block->is_i4x4_) {   // 4x4
        uint32_t* const top_right = (uint32_t*)(y_dst - BPS + 16);

        if (mb_y > 0) {
          if (mb_x >= dec->mb_w_ - 1) {    // on rightmost border
            memset(top_right, top_yuv[0].y[15], sizeof(*top_right));
          } else {
            memcpy(top_right, top_yuv[1].y, sizeof(*top_right));
          }
        }
        // replicate the top-right pixels below
        top_right[BPS] = top_right[2 * BPS] = top_right[3 * BPS] = top_right[0];

        // predict and add residuals for all 4x4 blocks in turn.
        for (n = 0; n < 16; ++n, bits <<= 2) {
          uint8_t* const dst = y_dst + kScan[n];
          VP8PredLuma4[block->imodes_[n]](dst);
          DoTransform(bits, coeffs + n * 16, dst);
        }
      } else {    // 16x16
        const int pred_func = CheckMode(mb_x, mb_y, block->imodes_[0]);
        VP8PredLuma16[pred_func](y_dst);
        if (bits != 0) {
          for (n = 0; n < 16; ++n, bits <<= 2) {
            DoTransform(bits, coeffs + n * 16, y_dst + kScan[n]);
          }
        }
      }
      {
        // Chroma
        const uint32_t bits_uv = block->non_zero_uv_;
        const int pred_func = CheckMode(mb_x, mb_y, block->uvmode_);
        VP8PredChroma8[pred_func](u_dst);
        VP8PredChroma8[pred_func](v_dst);
        DoUVTransform(bits_uv >> 0, coeffs + 16 * 16, u_dst);
        DoUVTransform(bits_uv >> 8, coeffs + 20 * 16, v_dst);
      }

      // stash away top samples for next block
      if (mb_y < dec->mb_h_ - 1) {
        memcpy(top_yuv[0].y, y_dst + 15 * BPS, 16);
        memcpy(top_yuv[0].u, u_dst +  7 * BPS,  8);
        memcpy(top_yuv[0].v, v_dst +  7 * BPS,  8);
      }
    }
    // Transfer reconstructed samples from yuv_b_ cache to final destination.
    {
      const int y_offset = cache_id * 16 * dec->cache_y_stride_;
      const int uv_offset = cache_id * 8 * dec->cache_uv_stride_;
      uint8_t* const y_out = dec->cache_y_ + mb_x * 16 + y_offset;
      uint8_t* const u_out = dec->cache_u_ + mb_x * 8 + uv_offset;
      uint8_t* const v_out = dec->cache_v_ + mb_x * 8 + uv_offset;
      for (j = 0; j < 16; ++j) {
        memcpy(y_out + j * dec->cache_y_stride_, y_dst + j * BPS, 16);
      }
      for (j = 0; j < 8; ++j) {
        memcpy(u_out + j * dec->cache_uv_stride_, u_dst + j * BPS, 8);
        memcpy(v_out + j * dec->cache_uv_stride_, v_dst + j * BPS, 8);
      }
    }
  }
}